

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Parser_invalidRootNode_Test::~Parser_invalidRootNode_Test(Parser_invalidRootNode_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, invalidRootNode)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<yodel xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "</yodel>\n";
    const std::vector<std::string> expectedIssues = {
        "Model element is of invalid type 'yodel'. A valid CellML root node should be of type 'model'.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}